

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_CheckHRAM(Expression *expr,Expression *src)

{
  bool bVar1;
  uint8_t *puVar2;
  Expression *src_local;
  Expression *expr_local;
  
  memcpy(expr,src,0x30);
  expr->isSymbol = false;
  bVar1 = rpn_isKnown(expr);
  if (bVar1) {
    if ((expr->val < 0xff00) || (0xffff < expr->val)) {
      if ((expr->val < 0) || (0xff < expr->val)) {
        error("Source address $%x not between $FF00 to $FFFF\n",(ulong)(uint)expr->val);
      }
    }
    else {
      expr->val = expr->val & 0xff;
    }
  }
  else {
    expr->rpnPatchSize = expr->rpnPatchSize + 1;
    puVar2 = reserveSpace(expr,1);
    *puVar2 = '`';
  }
  return;
}

Assistant:

void rpn_CheckHRAM(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;
	expr->isSymbol = false;

	if (!rpn_isKnown(expr)) {
		expr->rpnPatchSize++;
		*reserveSpace(expr, 1) = RPN_HRAM;
	} else if (expr->val >= 0xFF00 && expr->val <= 0xFFFF) {
		// That range is valid, but only keep the lower byte
		expr->val &= 0xFF;
	} else if (expr->val < 0 || expr->val > 0xFF) {
		error("Source address $%" PRIx32 " not between $FF00 to $FFFF\n", expr->val);
	}
}